

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char ** vrna_strsplit(char *string,char *delimiter)

{
  char *pcVar1;
  uint local_4c;
  char **ppcStack_48;
  uint n;
  char **split;
  char *save;
  char *token;
  char *ptr2;
  char *ptr;
  char *pcStack_18;
  char delim [2];
  char *delimiter_local;
  char *string_local;
  
  ppcStack_48 = (char **)0x0;
  local_4c = 0;
  if (string != (char *)0x0) {
    if ((delimiter == (char *)0x0) || (*delimiter == '\0')) {
      ptr._6_1_ = '&';
    }
    else {
      ptr._6_1_ = *delimiter;
    }
    ptr._7_1_ = 0;
    pcStack_18 = delimiter;
    token = strdup(string);
    ptr2 = token;
    while (pcVar1 = ptr2 + 1, *ptr2 != '\0') {
      ptr2 = pcVar1;
      if (*pcVar1 == ptr._6_1_) {
        local_4c = local_4c + 1;
      }
    }
    ptr2 = pcVar1;
    ppcStack_48 = (char **)vrna_alloc((local_4c + 2) * 8);
    local_4c = 0;
    save = strtok_r(token,(char *)((long)&ptr + 6),(char **)&split);
    while (save != (char *)0x0) {
      pcVar1 = vrna_strdup_printf("%s",save);
      ppcStack_48[local_4c] = pcVar1;
      save = strtok_r((char *)0x0,(char *)((long)&ptr + 6),(char **)&split);
      local_4c = local_4c + 1;
    }
    ppcStack_48[local_4c] = (char *)0x0;
    free(token);
  }
  return ppcStack_48;
}

Assistant:

PUBLIC char **
vrna_strsplit(const char  *string,
              const char  *delimiter)
{
  char          delim[2], *ptr, *ptr2, *token, *save, **split;
  unsigned int  n;

  split = NULL;
  n     = 0;

  if (string) {
    if ((delimiter) && (*delimiter))
      delim[0] = *delimiter;
    else
      delim[0] = '&';

    delim[1] = '\0';

    /* copy string such that we can alter it via strtok() */
    ptr2 = strdup(string);

    /* count how many elements we'll extract */
    ptr = ptr2;

    while (*ptr++)
      if (*ptr == *delim)
        n++;

    /*
     * allocate (n + 1) + 1 elements in split list
     * n + 1 elements plus 1 additional element to indicate
     * the last element in split
     */
    split = (char **)vrna_alloc(sizeof(char *) * (n + 2));

    n     = 0;
    token = strtok_r(ptr2, delim, &save);

    while (token != NULL) {
      split[n++]  = vrna_strdup_printf("%s", token);
      token       = strtok_r(NULL, delim, &save);
    }

    split[n] = NULL;

    free(ptr2);
  }

  return split;
}